

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

bool __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::try_seek(iterator *this,art_key_type search_key,bool *match,bool fwd)

{
  atomic<long> *paVar1;
  long *plVar2;
  byte key_byte;
  byte bVar3;
  byte bVar4;
  key_prefix_snapshot kVar5;
  node_type nVar6;
  undefined8 this_00;
  bool bVar7;
  undefined1 uVar8;
  uint uVar9;
  node_ptr nVar10;
  stack_entry *psVar11;
  long lVar12;
  ulong uVar13;
  size_t __n;
  ulong uVar14;
  version_type vVar15;
  undefined7 in_register_00000081;
  byte type;
  ulong uVar16;
  key_prefix_snapshot kVar17;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *pbVar18;
  void *__src;
  optimistic_lock *poVar19;
  find_result fVar20;
  undefined1 local_e8 [8];
  iter_result_opt cnxt;
  undefined1 local_a8 [8];
  iter_result_opt nxt;
  undefined8 local_80;
  key_prefix_snapshot key_prefix;
  undefined4 local_6c;
  undefined1 local_68 [8];
  read_critical_section c_critical_section;
  undefined1 auStack_50 [8];
  read_critical_section parent_critical_section;
  read_critical_section node_critical_section;
  
  uVar13 = search_key.field_0._8_8_;
  if ((this->stack_).c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->stack_).c.
      super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      std::
      deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
      ::pop_back(&(this->stack_).c);
    } while ((this->stack_).c.
             super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             (this->stack_).c.
             super__Deque_base<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  *match = false;
  optimistic_lock::try_read_lock((optimistic_lock *)auStack_50);
  if (auStack_50 != (undefined1  [8])0x0) {
    kVar17 = (key_prefix_snapshot)(this->db_->root).value._M_i.tagged_ptr;
    cnxt.
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>.
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>._24_8_
         = match;
    if (kVar17.u64 == 0) {
      olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
      ::iterator::try_seek();
      uVar8 = local_a8[0];
      goto LAB_00145e9e;
    }
    bVar7 = optimistic_lock::check
                      ((optimistic_lock *)auStack_50,(version_type)parent_critical_section.lock);
    if (bVar7) {
      local_6c = (undefined4)CONCAT71(in_register_00000081,fwd);
      uVar16 = uVar13;
      __src = search_key.field_0._0_8_;
      c_critical_section.version.version = (version_tag_type)this;
      while( true ) {
        pbVar18 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                   *)(kVar17.u64 & 0xfffffffffffffff8);
        optimistic_lock::try_read_lock((optimistic_lock *)&parent_critical_section.version);
        if (parent_critical_section.version.version == 0) break;
        bVar7 = optimistic_lock::check
                          ((optimistic_lock *)auStack_50,(version_type)parent_critical_section.lock)
        ;
        vVar15 = c_critical_section.version;
        if (!bVar7) {
LAB_00145e7b:
          auStack_50 = (undefined1  [8])0x0;
          break;
        }
        type = kVar17.f.key_prefix._M_elems[0] & 7;
        if ((kVar17.u64 & 7) == 0) {
          if ((((atomic<long> *)((long)auStack_50 + 8))->super___atomic_base<long>)._M_i < 1)
          goto LAB_00145f26;
          poVar19 = *(optimistic_lock **)auStack_50;
          LOCK();
          paVar1 = (atomic<long> *)((long)auStack_50 + 8);
          lVar12 = (paVar1->super___atomic_base<long>)._M_i;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if (parent_critical_section.lock != poVar19) goto LAB_00145e76;
          if (lVar12 < 1) goto LAB_00145ec5;
          auStack_50 = (undefined1  [8])0x0;
          nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
          _M_payload._M_value.node.tagged_ptr._0_2_ = 0xffff;
          nxt.
          super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
          _M_payload._8_8_ = 0;
          local_a8 = (undefined1  [8])kVar17;
          std::
          deque<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
          ::
          emplace_back<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>
                    ((deque<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry,std::allocator<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>::iterator::stack_entry>>
                      *)(c_critical_section.version.version + 8),(stack_entry *)local_a8);
          uVar14 = (ulong)*(uint *)&pbVar18->k_prefix;
          uVar16 = uVar13;
          if (uVar14 < uVar13) {
            uVar16 = uVar14;
          }
          uVar9 = memcmp(search_key.field_0._0_8_,&pbVar18->children_count,uVar16);
          if ((uVar9 == 0) && (uVar9 = 0, uVar14 != uVar13)) {
            uVar9 = -(uint)(uVar13 < uVar14) | 1;
          }
          if (*(long *)(parent_critical_section.version.version + 8) < 1) goto LAB_00145f26;
          LOCK();
          plVar2 = (long *)(parent_critical_section.version.version + 8);
          lVar12 = *plVar2;
          *plVar2 = *plVar2 + -1;
          UNLOCK();
          if (node_critical_section.lock !=
              *(optimistic_lock **)parent_critical_section.version.version) goto joined_r0x00145ec3;
          if (lVar12 < 1) goto LAB_00145ec5;
          parent_critical_section.version.version = 0;
          if (uVar9 == 0) {
            *(undefined1 *)
             cnxt.
             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
             ._24_8_ = 1;
          }
          else {
            if ((char)local_6c == '\0') {
              uVar8 = true;
              if ((int)uVar9 < 1) {
                uVar8 = try_prior((iterator *)vVar15.version);
              }
              goto LAB_00145e95;
            }
            if (-1 < (int)uVar9) {
              uVar8 = try_next((iterator *)vVar15.version);
              goto LAB_00145e95;
            }
          }
          uVar8 = true;
          goto LAB_00145e95;
        }
        kVar5 = (key_prefix_snapshot)*(key_prefix_snapshot *)&(pbVar18->k_prefix).f;
        uVar14 = kVar5.u64 >> 0x38;
        local_a8 = (undefined1  [8])0x0;
        __n = 8;
        if (uVar16 < 8) {
          __n = uVar16;
        }
        local_80 = kVar5;
        key_prefix = kVar17;
        memcpy(local_a8,__src,__n);
        uVar9 = detail::key_prefix_snapshot::get_shared_length
                          ((key_prefix_snapshot *)&local_80,(uint64_t)local_a8);
        vVar15 = c_critical_section.version;
        if (uVar9 < kVar5.f.key_prefix_length) {
          if ((byte)local_80._7_1_ <= uVar9) {
            __assert_fail("i < length()",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                          ,0x248,
                          "auto unodb::detail::key_prefix_snapshot::operator[](std::size_t) const");
          }
          bVar3 = *(byte *)((long)__src + (ulong)uVar9);
          bVar4 = *(byte *)((long)&local_80 + (ulong)uVar9);
          if (bVar3 == bVar4) {
            __assert_fail("cmp_ != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                          ,0x93b,
                          "bool unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                         );
          }
          if ((char)local_6c == '\0') {
            if (bVar4 <= bVar3) {
              bVar7 = try_right_most_traversal
                                ((iterator *)c_critical_section.version.version,
                                 (olc_node_ptr)key_prefix.f,(read_critical_section *)auStack_50);
              if (0 < *(long *)(parent_critical_section.version.version + 8)) {
                poVar19 = *(optimistic_lock **)parent_critical_section.version.version;
                LOCK();
                plVar2 = (long *)(parent_critical_section.version.version + 8);
                lVar12 = *plVar2;
                *plVar2 = *plVar2 + -1;
                UNLOCK();
                if (node_critical_section.lock == poVar19) goto LAB_00145ab1;
                olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                ::iterator::try_seek((iterator *)(ulong)(0 < lVar12));
                goto LAB_00145aba;
              }
              goto LAB_00145f26;
            }
            bVar7 = try_left_most_traversal
                              ((iterator *)c_critical_section.version.version,
                               (olc_node_ptr)key_prefix.f,(read_critical_section *)auStack_50);
            if (*(long *)(parent_critical_section.version.version + 8) < 1) goto LAB_00145f26;
            LOCK();
            plVar2 = (long *)(parent_critical_section.version.version + 8);
            lVar12 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (node_critical_section.lock ==
                *(optimistic_lock **)parent_critical_section.version.version) {
              if (lVar12 < 1) goto LAB_00145ec5;
              parent_critical_section.version.version = 0;
              if (!bVar7) break;
              uVar8 = try_prior((iterator *)vVar15.version);
              goto LAB_00145e95;
            }
          }
          else {
            if (bVar3 < bVar4) {
              bVar7 = try_left_most_traversal
                                ((iterator *)c_critical_section.version.version,
                                 (olc_node_ptr)key_prefix.f,(read_critical_section *)auStack_50);
              if (*(long *)(parent_critical_section.version.version + 8) < 1) goto LAB_00145f26;
              poVar19 = *(optimistic_lock **)parent_critical_section.version.version;
              LOCK();
              plVar2 = (long *)(parent_critical_section.version.version + 8);
              lVar12 = *plVar2;
              *plVar2 = *plVar2 + -1;
              UNLOCK();
              if (node_critical_section.lock == poVar19) {
LAB_00145ab1:
                if (lVar12 < 1) goto LAB_00145ec5;
              }
              else {
                olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                ::iterator::try_seek((iterator *)(ulong)(0 < lVar12));
              }
LAB_00145aba:
              parent_critical_section.version.version = 0;
              uVar8 = bVar7 & node_critical_section.lock == poVar19;
              goto LAB_00145e95;
            }
            bVar7 = try_right_most_traversal
                              ((iterator *)c_critical_section.version.version,
                               (olc_node_ptr)key_prefix.f,(read_critical_section *)auStack_50);
            if (*(long *)(parent_critical_section.version.version + 8) < 1) goto LAB_00145f26;
            LOCK();
            plVar2 = (long *)(parent_critical_section.version.version + 8);
            lVar12 = *plVar2;
            *plVar2 = *plVar2 + -1;
            UNLOCK();
            if (node_critical_section.lock ==
                *(optimistic_lock **)parent_critical_section.version.version) {
              if (lVar12 < 1) goto LAB_00145ec5;
              parent_critical_section.version.version = 0;
              if (!bVar7) break;
              uVar8 = try_next((iterator *)vVar15.version);
              goto LAB_00145e95;
            }
          }
joined_r0x00145ec3:
          if (lVar12 < 1) goto LAB_00145ec5;
LAB_00145e8a:
          parent_critical_section.version.version = 0;
          break;
        }
        nxt.
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _24_8_ = pbVar18;
        if (uVar16 < uVar14) {
LAB_00145ef7:
          __assert_fail("num_bytes <= key.size_bytes()",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                        ,0xc0,
                        "void unodb::detail::basic_art_key<std::span<const std::byte>>::shift_right(const std::size_t) [KeyType = std::span<const std::byte>]"
                       );
        }
        key_byte = *(byte *)((long)__src + uVar14);
        fVar20 = detail::
                 basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                 ::find_child(pbVar18,type,key_byte);
        this_00 = nxt.
                  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                  ._24_8_;
        if ((key_prefix_snapshot *)fVar20.second == (key_prefix_snapshot *)0x0) {
          if ((char)local_6c == '\0') {
            detail::
            basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
            ::lte_key_byte((iter_result_opt *)local_a8,
                           (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                            *)nxt.
                              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                              ._24_8_,type,key_byte);
            vVar15 = c_critical_section.version;
            if (nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                ._M_payload._16_1_ == '\0') {
              if ((((atomic<long> *)((long)auStack_50 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_00145f26;
              poVar19 = *(optimistic_lock **)auStack_50;
              LOCK();
              paVar1 = (atomic<long> *)((long)auStack_50 + 8);
              lVar12 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (parent_critical_section.lock == poVar19) {
                if (lVar12 < 1) goto LAB_00145ec5;
                auStack_50 = (undefined1  [8])0x0;
                if (*(long *)(parent_critical_section.version.version + 8) < 1) goto LAB_00145f26;
                LOCK();
                plVar2 = (long *)(parent_critical_section.version.version + 8);
                lVar12 = *plVar2;
                *plVar2 = *plVar2 + -1;
                UNLOCK();
                if (node_critical_section.lock !=
                    *(optimistic_lock **)parent_critical_section.version.version) {
LAB_00145ec0:
                  auStack_50 = (undefined1  [8])0x0;
                  goto joined_r0x00145ec3;
                }
                if (lVar12 < 1) goto LAB_00145ec5;
                parent_critical_section.version.version = 0;
                uVar8 = true;
                if ((*(long *)(c_critical_section.version.version + 0x38) ==
                     *(long *)(c_critical_section.version.version + 0x18)) ||
                   (pop((iterator *)c_critical_section.version.version),
                   *(long *)(vVar15.version + 0x38) == *(long *)(vVar15.version + 0x18)))
                goto LAB_00145e95;
                goto LAB_00145cf4;
              }
            }
            else {
              uVar8 = nxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                      ._M_payload._M_value.node.tagged_ptr._1_1_;
              nVar10 = detail::
                       basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                       ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                    *)this_00,type,
                                   nxt.
                                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                   ._M_payload._M_value.node.tagged_ptr._1_1_);
              bVar7 = optimistic_lock::check
                                ((optimistic_lock *)parent_critical_section.version.version,
                                 (version_type)node_critical_section.lock);
              if (!bVar7) goto LAB_00145e8a;
              if ((((atomic<long> *)((long)auStack_50 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_00145f26;
              poVar19 = *(optimistic_lock **)auStack_50;
              LOCK();
              paVar1 = (atomic<long> *)((long)auStack_50 + 8);
              lVar12 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (parent_critical_section.lock == poVar19) {
                if (lVar12 < 1) goto LAB_00145ec5;
                auStack_50 = (undefined1  [8])0x0;
                bVar7 = try_push((iterator *)c_critical_section.version.version,
                                 (olc_node_ptr)key_prefix.f,
                                 nxt.
                                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                 ._M_payload._M_value.node.tagged_ptr._0_1_,uVar8,
                                 (key_prefix_snapshot)
                                 nxt.
                                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                 ._M_payload._8_8_,
                                 (read_critical_section *)&parent_critical_section.version);
                if (!bVar7) break;
                uVar8 = try_right_most_traversal
                                  ((iterator *)c_critical_section.version.version,
                                   (olc_node_ptr)nVar10.tagged_ptr,
                                   (read_critical_section *)&parent_critical_section.version);
                goto LAB_00145e95;
              }
            }
          }
          else {
            detail::
            basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
            ::gte_key_byte((iter_result_opt *)local_a8,
                           (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                            *)nxt.
                              super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                              ._24_8_,type,key_byte);
            vVar15 = c_critical_section.version;
            if (nxt.
                super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                ._M_payload._16_1_ == '\0') {
              if ((((atomic<long> *)((long)auStack_50 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_00145f26;
              poVar19 = *(optimistic_lock **)auStack_50;
              LOCK();
              paVar1 = (atomic<long> *)((long)auStack_50 + 8);
              lVar12 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (parent_critical_section.lock == poVar19) {
                if (lVar12 < 1) goto LAB_00145ec5;
                auStack_50 = (undefined1  [8])0x0;
                if (*(long *)(parent_critical_section.version.version + 8) < 1) goto LAB_00145f26;
                LOCK();
                plVar2 = (long *)(parent_critical_section.version.version + 8);
                lVar12 = *plVar2;
                *plVar2 = *plVar2 + -1;
                UNLOCK();
                if (node_critical_section.lock !=
                    *(optimistic_lock **)parent_critical_section.version.version) goto LAB_00145ec0;
                if (lVar12 < 1) goto LAB_00145ec5;
                parent_critical_section.version.version = 0;
                uVar8 = true;
                if ((*(long *)(c_critical_section.version.version + 0x38) ==
                     *(long *)(c_critical_section.version.version + 0x18)) ||
                   (pop((iterator *)c_critical_section.version.version),
                   *(long *)(vVar15.version + 0x38) == *(long *)(vVar15.version + 0x18)))
                goto LAB_00145e95;
                goto LAB_00145b83;
              }
            }
            else {
              uVar8 = nxt.
                      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                      ._M_payload._M_value.node.tagged_ptr._1_1_;
              nVar10 = detail::
                       basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                       ::get_child((basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                                    *)this_00,type,
                                   nxt.
                                   super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                   ._M_payload._M_value.node.tagged_ptr._1_1_);
              bVar7 = optimistic_lock::check
                                ((optimistic_lock *)parent_critical_section.version.version,
                                 (version_type)node_critical_section.lock);
              if (!bVar7) goto LAB_00145e8a;
              if ((((atomic<long> *)((long)auStack_50 + 8))->super___atomic_base<long>)._M_i < 1)
              goto LAB_00145f26;
              poVar19 = *(optimistic_lock **)auStack_50;
              LOCK();
              paVar1 = (atomic<long> *)((long)auStack_50 + 8);
              lVar12 = (paVar1->super___atomic_base<long>)._M_i;
              (paVar1->super___atomic_base<long>)._M_i =
                   (paVar1->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              if (parent_critical_section.lock == poVar19) {
                if (lVar12 < 1) goto LAB_00145ec5;
                auStack_50 = (undefined1  [8])0x0;
                bVar7 = try_push((iterator *)c_critical_section.version.version,
                                 (olc_node_ptr)key_prefix.f,
                                 nxt.
                                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                 ._M_payload._M_value.node.tagged_ptr._0_1_,uVar8,
                                 (key_prefix_snapshot)
                                 nxt.
                                 super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
                                 ._M_payload._8_8_,
                                 (read_critical_section *)&parent_critical_section.version);
                if (!bVar7) break;
                uVar8 = try_left_most_traversal
                                  ((iterator *)c_critical_section.version.version,
                                   (olc_node_ptr)nVar10.tagged_ptr,
                                   (read_critical_section *)&parent_critical_section.version);
                goto LAB_00145e95;
              }
            }
          }
LAB_00145e76:
          if (0 < lVar12) goto LAB_00145e7b;
          goto LAB_00145ec5;
        }
        bVar7 = try_push((iterator *)c_critical_section.version.version,(olc_node_ptr)key_prefix.f,
                         key_byte,fVar20.first,local_80,
                         (read_critical_section *)&parent_critical_section.version);
        if (!bVar7) break;
        kVar17 = (key_prefix_snapshot)((key_prefix_snapshot *)fVar20.second)->u64;
        if (uVar16 == uVar14) goto LAB_00145ef7;
        bVar7 = optimistic_lock::check
                          ((optimistic_lock *)parent_critical_section.version.version,
                           (version_type)node_critical_section.lock);
        if (!bVar7) goto LAB_00145e8a;
        __src = (void *)((long)__src + uVar14 + 1);
        uVar16 = uVar16 + ~uVar14;
        auStack_50 = (undefined1  [8])parent_critical_section.version.version;
        parent_critical_section.lock = node_critical_section.lock;
        parent_critical_section.version.version = 0;
        optimistic_lock::read_critical_section::~read_critical_section
                  ((read_critical_section *)&parent_critical_section.version);
        if ((basic_node_ptr<unodb::detail::olc_node_header>)kVar17.u64 ==
            (basic_node_ptr<unodb::detail::olc_node_header>)0x0) {
          __assert_fail("node != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                        ,0x90a,
                        "bool unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::try_seek(art_key_type, bool &, bool) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                       );
        }
      }
      goto LAB_00145e92;
    }
    auStack_50 = (undefined1  [8])0x0;
  }
  uVar8 = 0;
  goto LAB_00145e9e;
  while( true ) {
    nVar6 = (node_type)uVar13;
    detail::
    basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
    ::next((iter_result_opt *)local_e8,pbVar18,nVar6 & (I256|I48),
           (psVar11->super_iter_result).child_index);
    if (cnxt.
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _M_payload._16_1_ == '\x01') {
      nVar10 = detail::
               basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
               ::get_child(pbVar18,nVar6 & (I256|I48),(psVar11->super_iter_result).child_index);
      bVar7 = optimistic_lock::check
                        ((optimistic_lock *)local_68,(version_type)c_critical_section.lock);
      if (!bVar7) goto LAB_00145f16;
      uVar8 = try_left_most_traversal
                        ((iterator *)c_critical_section.version.version,
                         (olc_node_ptr)nVar10.tagged_ptr,(read_critical_section *)local_68);
      goto LAB_00145e2d;
    }
    pop((iterator *)c_critical_section.version.version);
    if ((((header_type *)local_68)->m_lock).read_lock_count.super___atomic_base<long>._M_i < 1)
    goto LAB_00145f26;
    poVar19 = (optimistic_lock *)
              (((header_type *)local_68)->m_lock).version.version.super___atomic_base<unsigned_long>
              ._M_i;
    LOCK();
    paVar1 = &(((header_type *)local_68)->m_lock).read_lock_count;
    lVar12 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (c_critical_section.lock != poVar19) goto LAB_00145e5f;
    if (lVar12 < 1) goto LAB_00145ec5;
    local_68 = (undefined1  [8])0x0;
    optimistic_lock::read_critical_section::~read_critical_section
              ((read_critical_section *)local_68);
    vVar15 = c_critical_section.version;
    if (*(long *)(c_critical_section.version.version + 0x38) ==
        *(long *)(c_critical_section.version.version + 0x18)) break;
LAB_00145b83:
    psVar11 = top((iterator *)vVar15.version);
    uVar13 = (psVar11->super_iter_result).node.tagged_ptr;
    pbVar18 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
               *)(uVar13 & 0xfffffffffffffff8);
    c_critical_section.lock = (optimistic_lock *)psVar11->version;
    LOCK();
    paVar1 = &(pbVar18->super_header_type).m_lock.read_lock_count;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
    local_68 = (undefined1  [8])pbVar18;
    bVar7 = optimistic_lock::check((optimistic_lock *)pbVar18,(version_type)c_critical_section.lock)
    ;
    if (!bVar7) goto LAB_00145e64;
  }
  goto LAB_00145e95;
code_r0x00145d86:
  local_68 = (undefined1  [8])0x0;
  optimistic_lock::read_critical_section::~read_critical_section((read_critical_section *)local_68);
  vVar15 = c_critical_section.version;
  if (*(long *)(c_critical_section.version.version + 0x38) ==
      *(long *)(c_critical_section.version.version + 0x18)) goto LAB_00145e95;
LAB_00145cf4:
  psVar11 = top((iterator *)vVar15.version);
  uVar13 = (psVar11->super_iter_result).node.tagged_ptr;
  pbVar18 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
             *)(uVar13 & 0xfffffffffffffff8);
  c_critical_section.lock = (optimistic_lock *)psVar11->version;
  LOCK();
  paVar1 = &(pbVar18->super_header_type).m_lock.read_lock_count;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_68 = (undefined1  [8])pbVar18;
  bVar7 = optimistic_lock::check((optimistic_lock *)pbVar18,(version_type)c_critical_section.lock);
  if (bVar7) {
    nVar6 = (node_type)uVar13;
    detail::
    basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
    ::prior((iter_result_opt *)local_e8,pbVar18,nVar6 & (I256|I48),
            (psVar11->super_iter_result).child_index);
    if (cnxt.
        super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
        _M_payload._16_1_ == '\x01') {
      nVar10 = detail::
               basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
               ::get_child(pbVar18,nVar6 & (I256|I48),(psVar11->super_iter_result).child_index);
      bVar7 = optimistic_lock::check
                        ((optimistic_lock *)local_68,(version_type)c_critical_section.lock);
      if (bVar7) {
        uVar8 = try_right_most_traversal
                          ((iterator *)c_critical_section.version.version,
                           (olc_node_ptr)nVar10.tagged_ptr,(read_critical_section *)local_68);
      }
      else {
LAB_00145f16:
        local_68 = (undefined1  [8])0x0;
        uVar8 = false;
      }
LAB_00145e2d:
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)local_68);
      goto LAB_00145e95;
    }
    pop((iterator *)c_critical_section.version.version);
    if ((((header_type *)local_68)->m_lock).read_lock_count.super___atomic_base<long>._M_i < 1) {
LAB_00145f26:
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    poVar19 = (optimistic_lock *)
              (((header_type *)local_68)->m_lock).version.version.super___atomic_base<unsigned_long>
              ._M_i;
    LOCK();
    paVar1 = &(((header_type *)local_68)->m_lock).read_lock_count;
    lVar12 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (c_critical_section.lock == poVar19) {
      if (0 < lVar12) goto code_r0x00145d86;
      goto LAB_00145ec5;
    }
LAB_00145e5f:
    if (lVar12 < 1) {
LAB_00145ec5:
      __assert_fail("old_value > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
    }
  }
LAB_00145e64:
  local_68 = (undefined1  [8])0x0;
  optimistic_lock::read_critical_section::~read_critical_section((read_critical_section *)local_68);
LAB_00145e92:
  uVar8 = false;
LAB_00145e95:
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)&parent_critical_section.version);
LAB_00145e9e:
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)auStack_50);
  return (bool)(uVar8 & 1);
}

Assistant:

bool olc_db<Key, Value>::iterator::try_seek(art_key_type search_key,
                                            bool& match, bool fwd) {
  invalidate();   // invalidate the iterator (clear the stack).
  match = false;  // unless we wind up with an exact match.
  auto parent_critical_section = db_.root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return false;
    // LCOV_EXCL_STOP
  }
  auto node{db_.root.load()};
  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    return UNODB_DETAIL_LIKELY(parent_critical_section.try_read_unlock());
  }
  // A check() is required before acting on [node] by taking the lock.
  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return false;
    // LCOV_EXCL_STOP
  }
  const auto k = search_key;
  auto remaining_key{k};
  while (true) {
    UNODB_DETAIL_ASSERT(node != nullptr);
    // Lock version chaining (node and parent)
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart()))
      return false;  // LCOV_EXCL_LINE
    // TODO(thompsonbry) Should be redundant.  Checked before entering
    // the while() loop and at the bottom of the while() loop.
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return false;
    // Note: We DO NOT unlock the parent_critical_section here.  It is
    // done below along all code paths.
    const auto node_type = node.type();
    if (node_type == node_type::LEAF) {
      if (UNODB_DETAIL_UNLIKELY(
              !parent_critical_section.try_read_unlock()))  // unlock parent
        return false;                                       // LCOV_EXCL_LINE
      const auto* const leaf{node.template ptr<leaf_type*>()};
      if (UNODB_DETAIL_UNLIKELY(!try_push_leaf(node, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      const auto cmp_ = leaf->cmp(k);
      if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
        return false;  // LCOV_EXCL_LINE
      if (cmp_ == 0) {
        match = true;
        return true;  // done
      }
      if (fwd) {  // GTE semantics
        // if search_key < leaf, use leaf, else next().
        return (cmp_ < 0) ? true : try_next();
      }
      // LTE semantics: if search_key > leaf, use leaf, else prior().
      return (cmp_ > 0) ? true : try_prior();
    }
    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);
    auto* const inode{node.template ptr<inode_type*>()};  // some internal node.
    const auto key_prefix{inode->get_key_prefix().get_snapshot()};  // prefix
    const auto key_prefix_length{key_prefix.length()};  // length of that prefix
    const auto shared_length = key_prefix.get_shared_length(
        remaining_key.get_u64());  // #of prefix bytes matched.
    if (shared_length < key_prefix_length) {
      // We have visited an internal node whose prefix is longer than
      // the bytes in the key that we need to match.  To figure out
      // whether the search key would be located before or after the
      // current internal node, we need to compare the respective key
      // spans lexicographically.  Since we have [shared_length] bytes
      // in common, we know that the next byte will tell us the
      // relative ordering of the key vs the prefix. So now we compare
      // prefix and key and the first byte where they differ.
      const auto cmp_ = static_cast<int>(remaining_key[shared_length]) -
                        static_cast<int>(key_prefix[shared_length]);
      UNODB_DETAIL_ASSERT(cmp_ != 0);
      if (fwd) {
        // Note: parent_critical_section is unlocked along all paths
        // by try_(left|right)_most_traversal
        if (cmp_ < 0) {
          // FWD and the search key is ordered before this node.  We
          // want the left-most leaf under the node.
          return unlock_and_return(
              node_critical_section,
              try_left_most_traversal(node, parent_critical_section));
        }
        // FWD and the search key is ordered after this node.  Right
        // most descent and then next().
        return unlock_and_return(
                   node_critical_section,
                   try_right_most_traversal(node, parent_critical_section)) &&
               try_next();
      }
      // reverse traversal
      if (cmp_ < 0) {
        // REV and the search key is ordered before this node.  We
        // want the preceeding key.
        return unlock_and_return(
                   node_critical_section,
                   try_left_most_traversal(node, parent_critical_section)) &&
               try_prior();
      }
      // REV and the search key is ordered after this node.
      return unlock_and_return(
          node_critical_section,
          try_right_most_traversal(node, parent_critical_section));
    }
    remaining_key.shift_right(key_prefix_length);
    const auto res = inode->find_child(node_type, remaining_key[0]);
    if (res.second == nullptr) {
      // We are on a key byte during the descent that is not mapped by
      // the current node.  Where we go next depends on whether we are
      // doing forward or reverse traversal.
      if (fwd) {
        // FWD: Take the next child_index that is mapped in the data
        // and then do a left-most descent to land on the key that is
        // the immediate successor of the desired key in the data.
        //
        // Note: We are probing with a key byte which does not appear
        // in our list of keys (this was verified above) so this will
        // always be the index the first entry whose key byte is
        // greater-than the probe value and [false] if there is no
        // such entry.
        //
        // Note: [node] has not been pushed onto the stack yet!
        auto nxt = inode->gte_key_byte(node_type, remaining_key[0]);
        if (!nxt) {
          // Pop entries off the stack until we find one with a
          // right-sibling of the path we took to this node and then
          // do a left-most descent under that right-sibling. If there
          // is no such parent, we will wind up with an empty stack
          // (aka the end() iterator) and return that state.
          if (UNODB_DETAIL_UNLIKELY(
                  !parent_critical_section.try_read_unlock()))  // unlock parent
            return false;  // LCOV_EXCL_LINE
          if (UNODB_DETAIL_UNLIKELY(
                  !node_critical_section.try_read_unlock()))  // unlock node
            return false;                                     // LCOV_EXCL_LINE
          if (!empty()) pop();
          while (!empty()) {
            const auto& centry = top();
            const auto cnode{centry.node};  // a possible parent from the stack.
            auto c_critical_section(
                node_ptr_lock(cnode).rehydrate_read_lock(centry.version));
            if (UNODB_DETAIL_UNLIKELY(!c_critical_section.check()))
              return false;  // LCOV_EXCL_LINE
            auto* const icnode{cnode.template ptr<inode_type*>()};
            const auto cnxt = icnode->next(
                cnode.type(), centry.child_index);  // right-sibling.
            if (cnxt) {
              auto nchild = icnode->get_child(
                  cnode.type(), centry.child_index);  // get the child
              if (UNODB_DETAIL_UNLIKELY(
                      !c_critical_section.check()))  // before using [nchild]
                return false;                        // LCOV_EXCL_LINE
              return try_left_most_traversal(nchild, c_critical_section);
            }
            pop();
            if (UNODB_DETAIL_UNLIKELY(!c_critical_section.try_read_unlock()))
              return false;  // LCOV_EXCL_LINE
          }
          return true;  // stack is empty (aka end()).
        }
        const auto& tmp = nxt.value();  // unwrap.
        const auto child_index = tmp.child_index;
        const auto child =
            inode->get_child(node_type, child_index);  // get child
        if (UNODB_DETAIL_UNLIKELY(
                !node_critical_section.check()))  // before using [child]
          return false;                           // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(
                !parent_critical_section.try_read_unlock()))  // unlock parent
          return false;                                       // LCOV_EXCL_LINE
        // push the path we took
        if (UNODB_DETAIL_UNLIKELY(!try_push(node, tmp.key_byte, child_index,
                                            tmp.prefix, node_critical_section)))
          return false;  // LCOV_EXCL_LINE
        return try_left_most_traversal(child, node_critical_section);
      }
      // REV: Take the prior child_index that is mapped and then do
      // a right-most descent to land on the key that is the
      // immediate precessor of the desired key in the data.
      auto nxt = inode->lte_key_byte(node_type, remaining_key[0]);
      if (!nxt) {
        // Pop off the current entry until we find one with a
        // left-sibling and then do a right-most descent under that
        // left-sibling.  In the extreme case there is no such
        // previous entry and we will wind up with an empty stack.
        if (UNODB_DETAIL_UNLIKELY(
                !parent_critical_section.try_read_unlock()))  // unlock parent
          return false;                                       // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(
                !node_critical_section.try_read_unlock()))  // unlock node
          return false;                                     // LCOV_EXCL_LINE
        if (!empty()) pop();
        while (!empty()) {
          const auto& centry = top();
          const auto cnode{centry.node};  // a possible parent from stack
          auto c_critical_section(
              node_ptr_lock(cnode).rehydrate_read_lock(centry.version));
          if (UNODB_DETAIL_UNLIKELY(!c_critical_section.check()))
            return false;  // LCOV_EXCL_LINE
          auto* const icnode{cnode.template ptr<inode_type*>()};
          const auto cnxt =
              icnode->prior(cnode.type(), centry.child_index);  // left-sibling.
          if (cnxt) {
            auto nchild = icnode->get_child(
                cnode.type(), centry.child_index);  // get the child
            if (UNODB_DETAIL_UNLIKELY(
                    !c_critical_section.check()))  // before using [nchild]
              return false;                        // LCOV_EXCL_LINE
            return try_right_most_traversal(nchild, c_critical_section);
          }
          pop();
          if (UNODB_DETAIL_UNLIKELY(!c_critical_section.try_read_unlock()))
            return false;  // LCOV_EXCL_LINE
        }
        return true;  // stack is empty (aka end()).
      }
      const auto& tmp = nxt.value();  // unwrap.
      const auto child_index = tmp.child_index;
      const auto child =
          inode->get_child(node_type, child_index);  // get the child
      if (UNODB_DETAIL_UNLIKELY(
              !node_critical_section.check()))  // before using [child]
        return false;                           // LCOV_EXCL_LINE
      if (UNODB_DETAIL_UNLIKELY(
              !parent_critical_section.try_read_unlock()))  // unlock parent
        return false;                                       // LCOV_EXCL_LINE
      // push the path we took
      if (UNODB_DETAIL_UNLIKELY(!try_push(node, tmp.key_byte, child_index,
                                          tmp.prefix, node_critical_section)))
        return false;  // LCOV_EXCL_LINE
      return try_right_most_traversal(child, node_critical_section);
    }
    // Simple case. There is a child for the current key byte.
    const auto child_index{res.first};
    const auto* const child{res.second};
    if (UNODB_DETAIL_UNLIKELY(!try_push(node, remaining_key[0], child_index,
                                        key_prefix, node_critical_section)))
      return false;  // LCOV_EXCL_LINE
    node = *child;
    remaining_key.shift_right(1);
    // check node before using [child] and before we std::move() the RCS.
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check()))
      return false;  // LCOV_EXCL_LINE
    // Move RCS (will check invariant at top of loop)
    parent_critical_section = std::move(node_critical_section);
  }  // while ( true )
  UNODB_DETAIL_CANNOT_HAPPEN();
}